

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::EnumValueDescriptorProto::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  MessageLite *from_msg_00;
  _func_int **pp_Var3;
  Nonnull<const_char_*> pcVar4;
  Arena *arena;
  Arena *arena_00;
  
  arena_00 = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena_00 & 1) != 0) {
    arena_00 = *(Arena **)((ulong)arena_00 & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
    if ((uVar1 & 7) != 0) {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[1]._internal_metadata_.ptr_;
        *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | 1;
        arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[1]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),arena);
      }
      if ((uVar1 & 2) != 0) {
        from_msg_00 = (MessageLite *)from_msg[2]._vptr_MessageLite;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((EnumValueDescriptorProto *)&stack0xffffffffffffffd0);
          goto LAB_001a5c43;
        }
        if ((MessageLite *)to_msg[2]._vptr_MessageLite == (MessageLite *)0x0) {
          pp_Var3 = (_func_int **)
                    Arena::CopyConstruct<google::protobuf::EnumValueOptions>(arena_00,from_msg_00);
          to_msg[2]._vptr_MessageLite = pp_Var3;
        }
        else {
          EnumValueOptions::MergeImpl((MessageLite *)to_msg[2]._vptr_MessageLite,from_msg_00);
        }
      }
      if ((uVar1 & 4) != 0) {
        *(int *)&to_msg[2]._internal_metadata_.ptr_ = (int)from_msg[2]._internal_metadata_.ptr_;
      }
    }
    *(uint *)&to_msg[1]._vptr_MessageLite = *(uint *)&to_msg[1]._vptr_MessageLite | uVar1;
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_001a5c43:
  MergeImpl();
}

Assistant:

void EnumValueDescriptorProto::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumValueDescriptorProto*>(&to_msg);
  auto& from = static_cast<const EnumValueDescriptorProto&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumValueDescriptorProto)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_name(from._internal_name());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      ABSL_DCHECK(from._impl_.options_ != nullptr);
      if (_this->_impl_.options_ == nullptr) {
        _this->_impl_.options_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.options_);
      } else {
        _this->_impl_.options_->MergeFrom(*from._impl_.options_);
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_impl_.number_ = from._impl_.number_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}